

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

bool __thiscall
spvtools::val::Function::IsBlockType(Function *this,uint32_t merge_block_id,BlockType type)

{
  bool bVar1;
  pair<const_spvtools::val::BasicBlock_*,_bool> pVar2;
  
  pVar2 = GetBlock(this,merge_block_id);
  if (pVar2.first != (BasicBlock *)0x0) {
    bVar1 = BasicBlock::is_type(pVar2.first,type);
    return bVar1;
  }
  return false;
}

Assistant:

bool Function::IsBlockType(uint32_t merge_block_id, BlockType type) const {
  bool ret = false;
  const BasicBlock* block;
  std::tie(block, std::ignore) = GetBlock(merge_block_id);
  if (block) {
    ret = block->is_type(type);
  }
  return ret;
}